

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O0

bool __thiscall Vector::erase(Vector *this,void *ptr,Value v)

{
  Value VVar1;
  Value VVar2;
  Type *pTVar3;
  Type *pTVar4;
  ulong uVar5;
  runtime_error *this_00;
  long lVar6;
  uint8_t *puVar7;
  reference pvVar8;
  undefined1 local_88 [8];
  Value element_v;
  uint8_t *element_ptr;
  size_t i;
  uint8_t *base_ptr;
  size_t element_count;
  size_t element_size;
  Type *element_t;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vector_ptr;
  void *ptr_local;
  Vector *this_local;
  Value v_local;
  
  v_local.m_data = (void *)v.m_type.t_;
  this_local = (Vector *)v.m_data;
  pTVar3 = Typelib::Value::getType((Value *)&this_local);
  pTVar4 = (Type *)Typelib::Indirect::getIndirection();
  uVar5 = Typelib::Type::operator!=(pTVar3,pTVar4);
  if ((uVar5 & 1) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"type mismatch in vector insertion");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pTVar3 = (Type *)Typelib::Indirect::getIndirection();
  lVar6 = Typelib::Type::getSize();
  puVar7 = (uint8_t *)(**(code **)(*(long *)this + 200))(this,ptr);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ptr,0);
  element_ptr = (uint8_t *)0x0;
  while( true ) {
    if (puVar7 <= element_ptr) {
      return false;
    }
    element_v.m_type.t_ = (Type *)(pvVar8 + (long)element_ptr * lVar6);
    Typelib::Value::Value((Value *)local_88,element_v.m_type.t_,pTVar3);
    VVar2.m_type.t_ = (Type *)element_v.m_data;
    VVar2.m_data = (void *)local_88;
    VVar1.m_type.t_ = (Type *)v_local.m_data;
    VVar1.m_data = this_local;
    uVar5 = Typelib::compare(VVar2,VVar1);
    if ((uVar5 & 1) != 0) break;
    element_ptr = element_ptr + 1;
  }
  erase(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)ptr,(size_t)element_ptr);
  return true;
}

Assistant:

bool Vector::erase(void* ptr, Value v) const
{
    if (v.getType() != getIndirection())
        throw std::runtime_error("type mismatch in vector insertion");

    std::vector<uint8_t>* vector_ptr =
        reinterpret_cast< std::vector<uint8_t>* >(ptr);
    Type const& element_t  = getIndirection();
    size_t   element_size  = element_t.getSize();
    size_t   element_count = getElementCount(vector_ptr);

    uint8_t* base_ptr = &(*vector_ptr)[0];

    for (size_t i = 0; i < element_count; ++i)
    {
        uint8_t* element_ptr = base_ptr + i * element_size;
        Value    element_v(element_ptr, element_t);
        if (Typelib::compare(element_v, v))
        {
            erase(vector_ptr, i);
            return true;
        }
    }
    return false;
}